

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnyDistributionEdgeCalculator.cpp
# Opt level: O2

double __thiscall
AnyDistributionEdgeCalculator::insertSizeSumRightTail(AnyDistributionEdgeCalculator *this,int k)

{
  vector<double,_std::allocator<double>_> *this_00;
  reference pvVar1;
  int iVar2;
  value_type vVar3;
  
  iVar2 = k - this->insert_size_sum_ccdf_offset;
  if (k < this->insert_size_sum_ccdf_offset) {
    return 1.0;
  }
  this_00 = this->insert_size_sum_ccdf;
  vVar3 = 0.0;
  if (iVar2 < (int)((ulong)((long)(this_00->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(this_00,(long)iVar2);
    vVar3 = *pvVar1;
  }
  return vVar3;
}

Assistant:

double AnyDistributionEdgeCalculator::insertSizeSumRightTail(int k) const {
	if (k<insert_size_sum_ccdf_offset) return 1.0;
	int i = k - insert_size_sum_ccdf_offset;
	if (i < (int)insert_size_sum_ccdf->size()) {
		return insert_size_sum_ccdf->at(i);
	} else {
		return 0.0;
	}
}